

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void print_decl_spec(c2m_ctx_t c2m_ctx,FILE *f,decl_spec *decl_spec)

{
  char *pcVar1;
  decl_spec *decl_spec_local;
  FILE *f_local;
  c2m_ctx_t c2m_ctx_local;
  
  if ((undefined1  [32])((undefined1  [32])*decl_spec & (undefined1  [32])0x1) !=
      (undefined1  [32])0x0) {
    fprintf((FILE *)f," typedef, ");
  }
  if ((*(byte *)decl_spec >> 1 & 1) != 0) {
    fprintf((FILE *)f," extern, ");
  }
  if ((*(byte *)decl_spec >> 2 & 1) != 0) {
    fprintf((FILE *)f," static, ");
  }
  if ((*(byte *)decl_spec >> 3 & 1) != 0) {
    fprintf((FILE *)f," auto, ");
  }
  if ((*(byte *)decl_spec >> 4 & 1) != 0) {
    fprintf((FILE *)f," register, ");
  }
  if ((*(byte *)decl_spec >> 5 & 1) != 0) {
    fprintf((FILE *)f," thread local, ");
  }
  if ((*(byte *)decl_spec >> 6 & 1) != 0) {
    fprintf((FILE *)f," inline, ");
  }
  if (*(char *)decl_spec < '\0') {
    fprintf((FILE *)f," no return, ");
  }
  if (-1 < decl_spec->align) {
    fprintf((FILE *)f," align = %d, ",(ulong)(uint)decl_spec->align);
  }
  if (decl_spec->align_node != (node_t_conflict)0x0) {
    fprintf((FILE *)f," strictest align node %u, ",(ulong)decl_spec->align_node->uid);
  }
  if (decl_spec->linkage != N_IGNORE) {
    pcVar1 = "extern";
    if (decl_spec->linkage == N_STATIC) {
      pcVar1 = "static";
    }
    fprintf((FILE *)f," %s linkage, ",pcVar1);
  }
  print_type(c2m_ctx,f,decl_spec->type);
  return;
}

Assistant:

static void print_decl_spec (c2m_ctx_t c2m_ctx, FILE *f, struct decl_spec *decl_spec) {
  if (decl_spec->typedef_p) fprintf (f, " typedef, ");
  if (decl_spec->extern_p) fprintf (f, " extern, ");
  if (decl_spec->static_p) fprintf (f, " static, ");
  if (decl_spec->auto_p) fprintf (f, " auto, ");
  if (decl_spec->register_p) fprintf (f, " register, ");
  if (decl_spec->thread_local_p) fprintf (f, " thread local, ");
  if (decl_spec->inline_p) fprintf (f, " inline, ");
  if (decl_spec->no_return_p) fprintf (f, " no return, ");
  if (decl_spec->align >= 0) fprintf (f, " align = %d, ", decl_spec->align);
  if (decl_spec->align_node != NULL)
    fprintf (f, " strictest align node %u, ", decl_spec->align_node->uid);
  if (decl_spec->linkage != N_IGNORE)
    fprintf (f, " %s linkage, ", decl_spec->linkage == N_STATIC ? "static" : "extern");
  print_type (c2m_ctx, f, decl_spec->type);
}